

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDeviceGLImpl.cpp
# Opt level: O2

void __thiscall
Diligent::RenderDeviceGLImpl::CreateFramebuffer
          (RenderDeviceGLImpl *this,FramebufferDesc *Desc,IFramebuffer **ppFramebuffer)

{
  RefCntAutoPtr<Diligent::DeviceContextGLImpl> pDeviceContext;
  string msg;
  undefined1 local_48 [8];
  string local_40;
  
  RenderDeviceBase<Diligent::EngineGLImplTraits>::GetImmediateContext
            ((RenderDeviceBase<Diligent::EngineGLImplTraits> *)local_48,(size_t)this);
  if (local_48 == (undefined1  [8])0x0) {
    FormatString<char[44]>
              ((string *)(local_48 + 8),(char (*) [44])"Immediate device context has been destroyed"
              );
    DebugAssertionFailed
              (local_40._M_dataplus._M_p,"CreateFramebuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/RenderDeviceGLImpl.cpp"
               ,0x250);
    std::__cxx11::string::~string((string *)(local_48 + 8));
  }
  local_40._M_dataplus._M_p = (pointer)((long)local_48 + 0x750);
  RenderDeviceBase<Diligent::EngineGLImplTraits>::
  CreateFramebufferImpl<std::reference_wrapper<Diligent::GLContextState>>
            (&this->super_RenderDeviceBase<Diligent::EngineGLImplTraits>,ppFramebuffer,Desc,
             (reference_wrapper<Diligent::GLContextState> *)(local_48 + 8));
  RefCntAutoPtr<Diligent::DeviceContextGLImpl>::Release
            ((RefCntAutoPtr<Diligent::DeviceContextGLImpl> *)local_48);
  return;
}

Assistant:

void RenderDeviceGLImpl::CreateFramebuffer(const FramebufferDesc& Desc, IFramebuffer** ppFramebuffer)
{
    auto pDeviceContext = GetImmediateContext(0);
    VERIFY(pDeviceContext, "Immediate device context has been destroyed");
    auto& GLState = pDeviceContext->GetContextState();

    CreateFramebufferImpl(ppFramebuffer, Desc, std::ref(GLState));
}